

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O0

int __thiscall TCPConnection::Read(TCPConnection *this,char *buffer,int size)

{
  int *piVar1;
  int local_24;
  int local_20;
  int local_1c;
  int bytes_to_read;
  int size_local;
  char *buffer_local;
  TCPConnection *this_local;
  
  local_24 = 0x100 - (uint)this->RxOutOffset;
  local_1c = size;
  _bytes_to_read = buffer;
  buffer_local = (char *)this;
  piVar1 = std::min<int>(&local_1c,&local_24);
  local_20 = *piVar1;
  memcpy(_bytes_to_read,this->RxBuffer + this->RxOutOffset,(long)local_20);
  this->RxOutOffset = this->RxOutOffset + (short)local_20;
  if (0xff < this->RxOutOffset) {
    this->RxOutOffset = 0;
  }
  this->AcknowledgementNumber = local_20 + this->AcknowledgementNumber;
  this->CurrentWindow = this->CurrentWindow + (short)local_20;
  if (this->RxOutOffset == this->RxInOffset) {
    this->RxBufferEmpty = true;
  }
  return local_20;
}

Assistant:

int TCPConnection::Read(char* buffer, int size)
{
    int bytes_to_read = std::min(size, TCP_RX_WINDOW_SIZE - RxOutOffset);

    memcpy(buffer, &RxBuffer[RxOutOffset], bytes_to_read);

    RxOutOffset += bytes_to_read;
    if (RxOutOffset >= TCP_RX_WINDOW_SIZE)
    {
        RxOutOffset = 0;
    }
    AcknowledgementNumber += bytes_to_read;
    CurrentWindow += bytes_to_read;

    if (RxOutOffset == RxInOffset)
    {
        RxBufferEmpty = true;
    }

    return bytes_to_read;
}